

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

int * __thiscall
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::findNode
          (Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           *this,BSTNode *t,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  int iVar1;
  uint uVar2;
  
  while( true ) {
    if (t == (BSTNode *)0x0) {
      return (int *)0x0;
    }
    iVar1 = (*this->cmpp->_vptr_Comparator[2])(this->cmpp,key,t);
    uVar2 = 0xffffffff;
    if ((char)iVar1 == '\0') {
      uVar2 = (*this->cmpp->_vptr_Comparator[2])(this->cmpp,t,key);
      uVar2 = uVar2 & 0xff;
    }
    if (uVar2 == 0) break;
    if ((int)uVar2 < 0) {
      t = t->left;
    }
    else {
      t = t->right;
    }
  }
  return &t->value;
}

Assistant:

ValueType *findNode(BSTNode *t, const KeyType & key) const {
      if (t == NULL)  return NULL;
      int sign = compareKeys(key, t->key);
      if (sign == 0) return &t->value;
      if (sign < 0) {
         return findNode(t->left, key);
      } else {
         return findNode(t->right, key);
      }
   }